

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-pending-on-close.c
# Opt level: O2

int run_test_signal_close_loop_alive(void)

{
  int iVar1;
  uv_pid_t pid;
  uv_loop_t *loop;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  iVar1 = uv_loop_init(&::loop);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_signal_init(&::loop,&signal_hdl);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_signal_start(&signal_hdl,stop_loop_cb,0xd);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        uv_unref((uv_handle_t *)&signal_hdl);
        pid = uv_os_getpid();
        iVar1 = uv_kill(pid,0xd);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_run(&::loop,UV_RUN_DEFAULT);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            uv_close((uv_handle_t *)&signal_hdl,close_cb);
            eval_a = 1;
            iVar1 = uv_loop_alive(&::loop);
            eval_b = (int64_t)iVar1;
            if (eval_b == 1) {
              loop = &::loop;
              iVar1 = uv_run(&::loop,UV_RUN_DEFAULT);
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a == 0) {
                eval_a = 1;
                eval_b = (int64_t)close_cb_called;
                if (eval_b == 1) {
                  close_loop(loop);
                  eval_a = 0;
                  iVar1 = uv_loop_close(&::loop);
                  eval_b = (int64_t)iVar1;
                  if (eval_b == 0) {
                    uv_library_shutdown();
                    return 0;
                  }
                  pcVar3 = "uv_loop_close(&loop)";
                  pcVar2 = "0";
                  uVar4 = 0x70;
                }
                else {
                  pcVar3 = "close_cb_called";
                  pcVar2 = "1";
                  uVar4 = 0x6e;
                }
              }
              else {
                pcVar3 = "0";
                pcVar2 = "uv_run(&loop, UV_RUN_DEFAULT)";
                uVar4 = 0x6d;
              }
            }
            else {
              pcVar3 = "uv_loop_alive(&loop)";
              pcVar2 = "1";
              uVar4 = 0x6b;
            }
          }
          else {
            pcVar3 = "0";
            pcVar2 = "uv_run(&loop, UV_RUN_DEFAULT)";
            uVar4 = 0x69;
          }
        }
        else {
          pcVar3 = "0";
          pcVar2 = "uv_kill(uv_os_getpid(), 13)";
          uVar4 = 0x68;
        }
      }
      else {
        pcVar3 = "0";
        pcVar2 = "uv_signal_start(&signal_hdl, stop_loop_cb, 13)";
        uVar4 = 0x65;
      }
    }
    else {
      pcVar3 = "0";
      pcVar2 = "uv_signal_init(&loop, &signal_hdl)";
      uVar4 = 100;
    }
  }
  else {
    pcVar3 = "0";
    pcVar2 = "uv_loop_init(&loop)";
    uVar4 = 99;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(signal_close_loop_alive) {
  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_signal_init(&loop, &signal_hdl));
  ASSERT_OK(uv_signal_start(&signal_hdl, stop_loop_cb, SIGPIPE));
  uv_unref((uv_handle_t*) &signal_hdl);

  ASSERT_OK(uv_kill(uv_os_getpid(), SIGPIPE));
  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));
  uv_close((uv_handle_t*) &signal_hdl, close_cb);
  ASSERT_EQ(1, uv_loop_alive(&loop));

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}